

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valueimpl.hpp
# Opt level: O0

UserObject * __thiscall
camp::detail::ConvertVisitor<camp::UserObject>::operator()
          (undefined8 __return_storage_ptr__,ConvertVisitor<camp::UserObject> *this)

{
  Type expected;
  BadType *__return_storage_ptr___00;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [48];
  BadType local_68;
  ConvertVisitor<camp::UserObject> *local_20;
  ConvertVisitor<camp::UserObject> *this_local;
  undefined8 local_10;
  
  local_20 = this;
  local_10 = __return_storage_ptr__;
  __return_storage_ptr___00 = (BadType *)__cxa_allocate_exception(0x48);
  expected = mapType<camp::UserObject>();
  BadType::BadType(&local_68,noType,expected);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/detail/valueimpl.hpp"
             ,&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,
             "T camp::detail::ConvertVisitor<camp::UserObject>::operator()(NoType) const [T = camp::UserObject]"
             ,&local_c1);
  Error::prepare<camp::BadType>
            (__return_storage_ptr___00,&local_68,(string *)local_98,0x44,(string *)local_c0);
  __cxa_throw(__return_storage_ptr___00,&BadType::typeinfo,BadType::~BadType);
}

Assistant:

T operator()(NoType) const
    {
        // Error: trying to convert an empty value
        CAMP_ERROR(BadType(noType, mapType<T>()));
    }